

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void ObsGetLastMove(pyhanabi_observation_t *observation,int index,pyhanabi_history_item_t *item)

{
  HanabiMove *pHVar1;
  const_reference pvVar2;
  undefined8 *in_RDX;
  long *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  *in_stack_ffffffffffffffc0;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2e6,
                  "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
  }
  if (*in_RDI != 0) {
    if (in_RDX != (undefined8 *)0x0) {
      pHVar1 = (HanabiMove *)operator_new(0x10);
      hanabi_learning_env::HanabiObservation::LastMoves((HanabiObservation *)*in_RDI);
      pvVar2 = std::
               vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ::at(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *pHVar1 = pvVar2->move;
      pHVar1[1] = *(HanabiMove *)&pvVar2->player;
      *in_RDX = pHVar1;
      return;
    }
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2e8,
                  "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x2e7,
                "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
}

Assistant:

void ObsGetLastMove(pyhanabi_observation_t* observation, int index,
                    pyhanabi_history_item_t* item) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(item != nullptr);
  item->item = new hanabi_learning_env::HanabiHistoryItem(
      reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
          observation->observation)
          ->LastMoves()
          .at(index));
}